

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facets.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  Person p;
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  long *local_360 [2];
  long local_350 [2];
  long *local_340 [2];
  long local_330 [2];
  long *local_320 [2];
  long local_310 [2];
  PersonBuilder local_300;
  PersonBuilder local_248;
  PersonBuilder local_190;
  Person local_d8;
  
  Person::create();
  PersonBuilder::lives(&local_190);
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,"Beverly Hills, Rodeo Drive","");
  std::__cxx11::string::operator=((string *)local_300.person_reference,(string *)local_320);
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"90210","");
  std::__cxx11::string::operator=
            ((string *)&(local_300.person_reference)->post_code,(string *)local_340);
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"Los Angeles","");
  std::__cxx11::string::operator=((string *)&(local_300.person_reference)->city,(string *)local_360)
  ;
  PersonBuilder::works(&local_300);
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"SoftwareCorp","");
  std::__cxx11::string::operator=
            ((string *)&(local_248.person_reference)->company_name,(string *)local_380);
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"Software Engineer","");
  std::__cxx11::string::operator=
            ((string *)&(local_248.person_reference)->position,(string *)local_3a0);
  (local_248.person_reference)->annual_income = 10000000;
  PersonBuilder::operator_cast_to_Person(&local_d8,&local_248);
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  if (local_248.person.super__Optional_base<Person,_false,_false>._M_payload.
      super__Optional_payload<Person,_true,_false,_false>.super__Optional_payload_base<Person>.
      _M_engaged == true) {
    local_248.person.super__Optional_base<Person,_false,_false>._M_payload.
    super__Optional_payload<Person,_true,_false,_false>.super__Optional_payload_base<Person>.
    _M_engaged = false;
    Person::~Person((Person *)&local_248);
  }
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  if (local_340[0] != local_330) {
    operator_delete(local_340[0],local_330[0] + 1);
  }
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  if (local_300.person.super__Optional_base<Person,_false,_false>._M_payload.
      super__Optional_payload<Person,_true,_false,_false>.super__Optional_payload_base<Person>.
      _M_engaged == true) {
    local_300.person.super__Optional_base<Person,_false,_false>._M_payload.
    super__Optional_payload<Person,_true,_false,_false>.super__Optional_payload_base<Person>.
    _M_engaged = false;
    Person::~Person((Person *)&local_300);
  }
  if (local_190.person.super__Optional_base<Person,_false,_false>._M_payload.
      super__Optional_payload<Person,_true,_false,_false>.super__Optional_payload_base<Person>.
      _M_engaged == true) {
    local_190.person.super__Optional_base<Person,_false,_false>._M_payload.
    super__Optional_payload<Person,_true,_false,_false>.super__Optional_payload_base<Person>.
    _M_engaged = false;
    Person::~Person((Person *)&local_190);
  }
  poVar1 = operator<<((ostream *)&std::cout,&local_d8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  Person::~Person(&local_d8);
  return 0;
}

Assistant:

int main()
{
	Person p(Person::create()
		.lives().at("Beverly Hills, Rodeo Drive").with_postcode("90210").in("Los Angeles")
		.works().at("SoftwareCorp").as_a("Software Engineer").earning(int(10e6)));
	std::cout << p << std::endl;

	return 0;
}